

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v6::internal::
       parse_arg_id<char,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  char cVar2;
  basic_format_parse_context<char,_fmt::v6::internal::error_handler> *pbVar3;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> *pbVar4;
  uint index;
  unsigned_long_long uVar5;
  byte *pbVar6;
  byte *pbVar7;
  char *pcVar8;
  byte *pbVar9;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *psVar10;
  basic_string_view<char> name;
  format_arg arg;
  error_handler local_71;
  precision_checker<fmt::v6::internal::error_handler> local_70;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_68;
  undefined8 uStack_50;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_48;
  int local_38;
  undefined8 uStack_30;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    psVar10 = handler->handler;
    pbVar3 = (psVar10->
             super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
             ).parse_context_;
    index = pbVar3->next_arg_id_;
    if ((int)index < 0) {
      error_handler::on_error
                ((error_handler *)pbVar3,"cannot switch from manual to automatic argument indexing")
      ;
    }
    pbVar4 = (psVar10->
             super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
             ).context_;
    pbVar3->next_arg_id_ = index + 1;
LAB_0012e07f:
    basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::get((format_arg *)&local_48.string,&pbVar4->args_,index);
    if (local_38 != 0) {
      local_68.long_long_value = local_48.long_long_value;
      local_68.string.size = local_48.string.size;
      uStack_50 = uStack_30;
      local_70.handler_ = &local_71;
      uVar5 = visit_format_arg<fmt::v6::internal::precision_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                        (&local_70,
                         (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_68.string);
      if ((uVar5 & 0xffffffff80000000) == 0) {
        ((psVar10->
         super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->precision = (int)uVar5;
        return begin;
      }
LAB_0012e211:
      error_handler::on_error(&local_71,"number is too big");
    }
    pcVar8 = "argument index out of range";
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      begin = begin + 1;
      if (bVar1 == 0x30) {
        index = 0;
      }
      else {
        index = 0;
        pcVar8 = begin;
        while (index < 0xccccccd) {
          index = ((int)pcVar8[-1] + index * 10) - 0x30;
          begin = end;
          if ((pcVar8 == end) ||
             (cVar2 = *pcVar8, begin = pcVar8, pcVar8 = pcVar8 + 1, 9 < (byte)(cVar2 - 0x30U)))
          goto LAB_0012e1cc;
        }
        index = 0x80000000;
        begin = pcVar8 + -1;
LAB_0012e1cc:
        if ((int)index < 0) {
          pcVar8 = "number is too big";
          goto LAB_0012e23e;
        }
      }
      if ((begin != end) && ((*begin == ':' || (*begin == '}')))) {
        psVar10 = handler->handler;
        pbVar3 = (psVar10->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                 ).parse_context_;
        if (0 < pbVar3->next_arg_id_) {
          error_handler::on_error
                    ((error_handler *)pbVar3,
                     "cannot switch from automatic to manual argument indexing");
        }
        pbVar3->next_arg_id_ = -1;
        pbVar4 = (psVar10->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                 ).context_;
        goto LAB_0012e07f;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar7 = (byte *)(begin + 1);
      do {
        pbVar6 = pbVar7;
        pbVar9 = (byte *)end;
        if (pbVar6 == (byte *)end) break;
        bVar1 = *pbVar6;
        pbVar7 = pbVar6 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar9 = pbVar6, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pbVar9 - (long)begin;
      psVar10 = handler->handler;
      name.data_ = begin;
      basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::arg
                ((format_arg *)&local_48.string,
                 (psVar10->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                 ).context_,name);
      local_68.long_long_value = local_48.long_long_value;
      local_68.string.size = local_48.string.size;
      uStack_50 = uStack_30;
      local_70.handler_ = &local_71;
      uVar5 = visit_format_arg<fmt::v6::internal::precision_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                        (&local_70,
                         (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_68.string);
      if ((uVar5 & 0xffffffff80000000) == 0) {
        ((psVar10->
         super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->precision = (int)uVar5;
        return (char *)pbVar9;
      }
      goto LAB_0012e211;
    }
    pcVar8 = "invalid format string";
  }
LAB_0012e23e:
  error_handler::on_error((error_handler *)&local_68.string,pcVar8);
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}